

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O2

ChVector<double> * __thiscall
chrono::fea::ChElementShellReissner4::ComputeNormal
          (ChVector<double> *__return_storage_ptr__,ChElementShellReissner4 *this,double U,double V)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  pointer psVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  ChVector<double> result;
  undefined1 local_28 [16];
  double local_18;
  
  psVar5 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar6 = psVar5[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar7 = (psVar5->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar8 = psVar5[2].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar9 = psVar5[3].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  dVar1 = *(double *)((long)&peVar6->super_ChNodeFEAbase + 0x20);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar1;
  auVar31._8_8_ = *(undefined8 *)&peVar7->field_0x30;
  auVar31._0_8_ = *(undefined8 *)&peVar7->field_0x30;
  dVar10 = (V + 1.0) * 0.25;
  dVar11 = (V + 1.0) * -0.25;
  dVar12 = (1.0 - V) * -0.25;
  dVar13 = (1.0 - U) * 0.25;
  dVar14 = (1.0 - V) * 0.25;
  dVar15 = (U + 1.0) * 0.25;
  dVar16 = (1.0 - U) * -0.25;
  dVar17 = (U + 1.0) * -0.25;
  dVar2 = *(double *)((long)&peVar7->super_ChNodeFEAbase + 0x20);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar2;
  auVar19 = vunpcklpd_avx(auVar31,auVar25);
  dVar3 = *(double *)((long)&peVar8->super_ChNodeFEAbase + 0x20);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar3;
  dVar4 = *(double *)((long)&peVar9->super_ChNodeFEAbase + 0x20);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar4;
  auVar20._0_8_ =
       *(double *)&peVar7->field_0x28 * dVar10 + *(double *)&peVar6->field_0x28 * dVar11 +
       dVar12 * *(double *)&peVar8->field_0x28 + dVar14 * *(double *)&peVar9->field_0x28;
  auVar20._8_8_ =
       *(double *)&peVar7->field_0x30 * dVar10 + *(double *)&peVar6->field_0x30 * dVar11 +
       dVar12 * *(double *)&peVar8->field_0x30 + dVar14 * *(double *)&peVar9->field_0x30;
  auVar27._8_8_ = *(undefined8 *)&peVar6->field_0x30;
  auVar27._0_8_ = *(undefined8 *)&peVar6->field_0x30;
  auVar23._8_8_ = *(undefined8 *)&peVar8->field_0x30;
  auVar23._0_8_ = *(undefined8 *)&peVar8->field_0x30;
  auVar21 = vunpcklpd_avx(auVar27,auVar28);
  auVar22 = vunpcklpd_avx(auVar23,auVar29);
  auVar24._8_8_ = *(undefined8 *)&peVar9->field_0x30;
  auVar24._0_8_ = *(undefined8 *)&peVar9->field_0x30;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar10 * dVar2 + dVar1 * dVar11 + dVar3 * dVar12 + dVar4 * dVar14;
  auVar23 = vshufpd_avx(auVar20,auVar26,1);
  auVar24 = vunpcklpd_avx(auVar24,auVar30);
  auVar18._0_8_ =
       dVar15 * auVar19._0_8_ + auVar21._0_8_ * dVar13 + dVar16 * auVar22._0_8_ +
       dVar17 * auVar24._0_8_;
  auVar18._8_8_ =
       dVar15 * auVar19._8_8_ + auVar21._8_8_ * dVar13 + dVar16 * auVar22._8_8_ +
       dVar17 * auVar24._8_8_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       *(double *)&peVar6->field_0x28 * dVar13 + dVar15 * *(double *)&peVar7->field_0x28 +
       dVar16 * *(double *)&peVar8->field_0x28 + dVar17 * *(double *)&peVar9->field_0x28;
  auVar19 = vunpcklpd_avx(auVar21,auVar18);
  auVar22._0_8_ = auVar19._0_8_ * auVar23._0_8_;
  auVar22._8_8_ = auVar19._8_8_ * auVar23._8_8_;
  local_28 = vfmsub231pd_fma(auVar22,auVar20,auVar18);
  auVar23 = vshufpd_avx(auVar18,auVar18,1);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = auVar23._0_8_ * auVar20._0_8_;
  auVar23 = vfmsub231sd_fma(auVar19,auVar26,auVar21);
  local_18 = auVar23._0_8_;
  ChVector<double>::GetNormalized(__return_storage_ptr__,(ChVector<double> *)local_28);
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChElementShellReissner4::ComputeNormal(const double U, const double V) {
    ShapeVector Nx;
    ShapeVector Ny;
    ShapeFunctionsDerivativeX(Nx, U, V);
    ShapeFunctionsDerivativeY(Ny, U, V);

    const ChVector<>& pA = m_nodes[0]->GetPos();
    const ChVector<>& pB = m_nodes[1]->GetPos();
    const ChVector<>& pC = m_nodes[2]->GetPos();
    const ChVector<>& pD = m_nodes[3]->GetPos();

    ChVector<> Gx = Nx(0) * pA + Nx(1) * pB + Nx(2) * pC + Nx(3) * pD;
    ChVector<> Gy = Ny(0) * pA + Ny(1) * pB + Ny(2) * pC + Ny(3) * pD;

    ChVector<> mnorm = Vcross(Gx, Gy);
    return mnorm.GetNormalized();
}